

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_writeEglConfig(qpTestLog *log,qpEglConfigInfo *config)

{
  deBool dVar1;
  qpXmlAttributeType qVar2;
  qpXmlAttribute attribs [64];
  
  deMutex_lock(log->lock);
  attribs[0].intValue = config->bufferSize;
  attribs[0].name = "BufferSize";
  qVar2 = QP_XML_ATTRIBUTE_INT;
  attribs[0].stringValue = "<intAttrib>";
  attribs[0].boolValue = -1;
  attribs[1].intValue = config->redSize;
  attribs[1].name = "RedSize";
  attribs[1].stringValue = "<intAttrib>";
  attribs[1].boolValue = -1;
  attribs[2].intValue = config->greenSize;
  attribs[2].name = "GreenSize";
  attribs[2].stringValue = "<intAttrib>";
  attribs[2].boolValue = -1;
  attribs[3].intValue = config->blueSize;
  attribs[3].name = "BlueSize";
  attribs[3].stringValue = "<intAttrib>";
  attribs[3].boolValue = -1;
  attribs[4].intValue = config->luminanceSize;
  attribs[4].name = "LuminanceSize";
  attribs[4].stringValue = "<intAttrib>";
  attribs[4].boolValue = -1;
  attribs[5].intValue = config->alphaSize;
  attribs[5].name = "AlphaSize";
  attribs[5].stringValue = "<intAttrib>";
  attribs[5].boolValue = -1;
  attribs[6].intValue = config->alphaMaskSize;
  attribs[6].name = "AlphaMaskSize";
  attribs[6].stringValue = "<intAttrib>";
  attribs[6].boolValue = -1;
  attribs[7].boolValue = config->bindToTextureRGB;
  attribs[7].name = "BindToTextureRGB";
  attribs[7].type = QP_XML_ATTRIBUTE_BOOL;
  attribs[7].stringValue = "<boolAttrib>";
  attribs[7].intValue = -0x2a7;
  attribs[8].boolValue = config->bindToTextureRGBA;
  attribs[8].name = "BindToTextureRGBA";
  attribs[8].stringValue = "<boolAttrib>";
  attribs[8].intValue = -0x2a7;
  attribs[9].stringValue = config->colorBufferType;
  attribs[9].name = "ColorBufferType";
  attribs[9].type = QP_XML_ATTRIBUTE_STRING;
  attribs[9].intValue = -0x2a6;
  attribs[9].boolValue = -1;
  attribs[10].stringValue = config->configCaveat;
  attribs[10].name = "ConfigCaveat";
  attribs[10].type = QP_XML_ATTRIBUTE_STRING;
  attribs[10].intValue = -0x2a6;
  attribs[10].boolValue = -1;
  attribs[0xb].intValue = config->configID;
  attribs[0xb].name = "ConfigID";
  attribs[0xb].stringValue = "<intAttrib>";
  attribs[0xb].boolValue = -1;
  attribs[0xc].stringValue = config->conformant;
  attribs[0xc].name = "Conformant";
  attribs[0xc].type = QP_XML_ATTRIBUTE_STRING;
  attribs[0xc].intValue = -0x2a6;
  attribs[0xc].boolValue = -1;
  attribs[0xd].intValue = config->depthSize;
  attribs[0xd].name = "DepthSize";
  attribs[0xd].stringValue = "<intAttrib>";
  attribs[0xd].boolValue = -1;
  attribs[0xe].intValue = config->level;
  attribs[0xe].name = "Level";
  attribs[0xe].stringValue = "<intAttrib>";
  attribs[0xe].boolValue = -1;
  attribs[0xf].intValue = config->maxPBufferWidth;
  attribs[0xf].name = "MaxPBufferWidth";
  attribs[0xf].stringValue = "<intAttrib>";
  attribs[0xf].boolValue = -1;
  attribs[0x10].intValue = config->maxPBufferHeight;
  attribs[0x10].name = "MaxPBufferHeight";
  attribs[0x10].stringValue = "<intAttrib>";
  attribs[0x10].boolValue = -1;
  attribs[0x11].intValue = config->maxPBufferPixels;
  attribs[0x11].name = "MaxPBufferPixels";
  attribs[0x11].stringValue = "<intAttrib>";
  attribs[0x11].boolValue = -1;
  attribs[0x12].intValue = config->maxSwapInterval;
  attribs[0x12].name = "MaxSwapInterval";
  attribs[0x12].stringValue = "<intAttrib>";
  attribs[0x12].boolValue = -1;
  attribs[0x13].intValue = config->minSwapInterval;
  attribs[0x13].name = "MinSwapInterval";
  attribs[0x13].stringValue = "<intAttrib>";
  attribs[0x13].boolValue = -1;
  attribs[0x14].boolValue = config->nativeRenderable;
  attribs[0x14].name = "NativeRenderable";
  attribs[0x14].stringValue = "<boolAttrib>";
  attribs[0x14].intValue = -0x2a7;
  attribs[0x15].stringValue = config->renderableType;
  attribs[0x15].name = "RenderableType";
  attribs[0x15].type = QP_XML_ATTRIBUTE_STRING;
  attribs[0x15].intValue = -0x2a6;
  attribs[0x15].boolValue = -1;
  attribs[0x16].intValue = config->sampleBuffers;
  attribs[0x16].name = "SampleBuffers";
  attribs[0x16].stringValue = "<intAttrib>";
  attribs[0x16].boolValue = -1;
  attribs[0x17].intValue = config->samples;
  attribs[0x17].name = "Samples";
  attribs[0x17].stringValue = "<intAttrib>";
  attribs[0x17].boolValue = -1;
  attribs[0x18].intValue = config->stencilSize;
  attribs[0x18].name = "StencilSize";
  attribs[0x18].stringValue = "<intAttrib>";
  attribs[0x18].boolValue = -1;
  attribs[0x19].stringValue = config->surfaceTypes;
  attribs[0x19].name = "SurfaceTypes";
  attribs[0x19].type = QP_XML_ATTRIBUTE_STRING;
  attribs[0x19].intValue = -0x2a6;
  attribs[0x19].boolValue = -1;
  attribs[0x1a].stringValue = config->transparentType;
  attribs[0x1a].name = "TransparentType";
  attribs[0x1a].type = QP_XML_ATTRIBUTE_STRING;
  attribs[0x1a].intValue = -0x2a6;
  attribs[0x1a].boolValue = -1;
  attribs[0x1b].intValue = config->transparentRedValue;
  attribs[0x1b].name = "TransparentRedValue";
  attribs[0x1b].stringValue = "<intAttrib>";
  attribs[0x1b].boolValue = -1;
  attribs[0x1c].intValue = config->transparentGreenValue;
  attribs[0x1c].name = "TransparentGreenValue";
  attribs[0x1c].stringValue = "<intAttrib>";
  attribs[0x1c].boolValue = -1;
  attribs[0x1d].intValue = config->transparentBlueValue;
  attribs[0x1d].name = "TransparentBlueValue";
  attribs[0x1d].stringValue = "<intAttrib>";
  attribs[0x1d].boolValue = -1;
  attribs[0].type = qVar2;
  attribs[1].type = qVar2;
  attribs[2].type = qVar2;
  attribs[3].type = qVar2;
  attribs[4].type = qVar2;
  attribs[5].type = qVar2;
  attribs[6].type = qVar2;
  attribs[8].type = attribs[7].type;
  attribs[0xb].type = qVar2;
  attribs[0xd].type = qVar2;
  attribs[0xe].type = qVar2;
  attribs[0xf].type = qVar2;
  attribs[0x10].type = qVar2;
  attribs[0x11].type = qVar2;
  attribs[0x12].type = qVar2;
  attribs[0x13].type = qVar2;
  attribs[0x14].type = attribs[7].type;
  attribs[0x16].type = qVar2;
  attribs[0x17].type = qVar2;
  attribs[0x18].type = qVar2;
  attribs[0x1b].type = qVar2;
  attribs[0x1c].type = qVar2;
  attribs[0x1d].type = qVar2;
  dVar1 = qpXmlWriter_startElement(log->writer,"EglConfig",0x1e,attribs);
  if (dVar1 != 0) {
    dVar1 = qpXmlWriter_endElement(log->writer,"EglConfig");
    if (dVar1 != 0) goto LAB_007e5262;
  }
  qVar2 = QP_XML_ATTRIBUTE_STRING;
  qpPrintf("qpTestLog_writeEglConfig(): Writing XML failed\n");
LAB_007e5262:
  deMutex_unlock(log->lock);
  return qVar2;
}

Assistant:

deBool qpTestLog_writeEglConfig (qpTestLog* log, const qpEglConfigInfo* config)
{
	qpXmlAttribute	attribs[64];
	int				numAttribs = 0;

	DE_ASSERT(log && config);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetIntAttrib		("BufferSize", config->bufferSize);
	attribs[numAttribs++] = qpSetIntAttrib		("RedSize", config->redSize);
	attribs[numAttribs++] = qpSetIntAttrib		("GreenSize", config->greenSize);
	attribs[numAttribs++] = qpSetIntAttrib		("BlueSize", config->blueSize);
	attribs[numAttribs++] = qpSetIntAttrib		("LuminanceSize", config->luminanceSize);
	attribs[numAttribs++] = qpSetIntAttrib		("AlphaSize", config->alphaSize);
	attribs[numAttribs++] = qpSetIntAttrib		("AlphaMaskSize", config->alphaMaskSize);
	attribs[numAttribs++] = qpSetBoolAttrib		("BindToTextureRGB", config->bindToTextureRGB);
	attribs[numAttribs++] = qpSetBoolAttrib		("BindToTextureRGBA", config->bindToTextureRGBA);
	attribs[numAttribs++] = qpSetStringAttrib	("ColorBufferType", config->colorBufferType);
	attribs[numAttribs++] = qpSetStringAttrib	("ConfigCaveat", config->configCaveat);
	attribs[numAttribs++] = qpSetIntAttrib		("ConfigID", config->configID);
	attribs[numAttribs++] = qpSetStringAttrib	("Conformant", config->conformant);
	attribs[numAttribs++] = qpSetIntAttrib		("DepthSize", config->depthSize);
	attribs[numAttribs++] = qpSetIntAttrib		("Level", config->level);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxPBufferWidth", config->maxPBufferWidth);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxPBufferHeight", config->maxPBufferHeight);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxPBufferPixels", config->maxPBufferPixels);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxSwapInterval", config->maxSwapInterval);
	attribs[numAttribs++] = qpSetIntAttrib		("MinSwapInterval", config->minSwapInterval);
	attribs[numAttribs++] = qpSetBoolAttrib		("NativeRenderable", config->nativeRenderable);
	attribs[numAttribs++] = qpSetStringAttrib	("RenderableType", config->renderableType);
	attribs[numAttribs++] = qpSetIntAttrib		("SampleBuffers", config->sampleBuffers);
	attribs[numAttribs++] = qpSetIntAttrib		("Samples", config->samples);
	attribs[numAttribs++] = qpSetIntAttrib		("StencilSize", config->stencilSize);
	attribs[numAttribs++] = qpSetStringAttrib	("SurfaceTypes", config->surfaceTypes);
	attribs[numAttribs++] = qpSetStringAttrib	("TransparentType", config->transparentType);
	attribs[numAttribs++] = qpSetIntAttrib		("TransparentRedValue", config->transparentRedValue);
	attribs[numAttribs++] = qpSetIntAttrib		("TransparentGreenValue", config->transparentGreenValue);
	attribs[numAttribs++] = qpSetIntAttrib		("TransparentBlueValue", config->transparentBlueValue);
	DE_ASSERT(numAttribs <= DE_LENGTH_OF_ARRAY(attribs));

	if (!qpXmlWriter_startElement(log->writer, "EglConfig", numAttribs, attribs) ||
		!qpXmlWriter_endElement(log->writer, "EglConfig"))
	{
		qpPrintf("qpTestLog_writeEglConfig(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}